

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

Belief * __thiscall despot::FullChainBelief::MakeCopy(FullChainBelief *this)

{
  DSPOMDP *model;
  FullChainBelief *this_00;
  size_type sVar1;
  const_reference pvVar2;
  size_type sVar3;
  const_reference this_01;
  const_reference pvVar4;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *this_02;
  FullChainBelief *this_local;
  
  this_00 = (FullChainBelief *)operator_new(0x60);
  model = *(DSPOMDP **)&this->field_0x8;
  this_02 = &this->alpha_;
  sVar1 = std::
          vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
          ::size(this_02);
  pvVar2 = std::
           vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
           ::operator[](this_02,0);
  sVar3 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(pvVar2);
  pvVar2 = std::
           vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
           ::operator[](this_02,0);
  this_01 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::operator[](pvVar2,0);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](this_01,0);
  FullChainBelief(this_00,model,(int)sVar1,(int)sVar3,*pvVar4);
  return &this_00->super_Belief;
}

Assistant:

Belief* FullChainBelief::MakeCopy() const {
	return new FullChainBelief(model_, alpha_.size(), alpha_[0].size(),
		alpha_[0][0][0]);
}